

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O2

ggml_tensor * __thiscall
test_opt_step_adamw::build_graph(test_opt_step_adamw *this,ggml_context *ctx)

{
  ggml_tensor *pgVar1;
  ggml_tensor *pgVar2;
  ggml_tensor *pgVar3;
  ggml_tensor *pgVar4;
  ggml_tensor *pgVar5;
  
  pgVar1 = test_case::ggml_new_tensor_4d
                     (&this->super_test_case,ctx,this->type,(this->ne)._M_elems[0],
                      (this->ne)._M_elems[1],(this->ne)._M_elems[2],(this->ne)._M_elems[3]);
  ggml_set_param(ctx,pgVar1);
  ggml_set_name(pgVar1,"a");
  pgVar2 = test_case::ggml_new_tensor_4d
                     (&this->super_test_case,ctx,this->type,(this->ne)._M_elems[0],
                      (this->ne)._M_elems[1],(this->ne)._M_elems[2],(this->ne)._M_elems[3]);
  ggml_set_name(pgVar2,"grad");
  pgVar3 = test_case::ggml_new_tensor_4d
                     (&this->super_test_case,ctx,this->type,(this->ne)._M_elems[0],
                      (this->ne)._M_elems[1],(this->ne)._M_elems[2],(this->ne)._M_elems[3]);
  ggml_set_name(pgVar3,"grad_m");
  pgVar4 = test_case::ggml_new_tensor_4d
                     (&this->super_test_case,ctx,this->type,(this->ne)._M_elems[0],
                      (this->ne)._M_elems[1],(this->ne)._M_elems[2],(this->ne)._M_elems[3]);
  ggml_set_name(pgVar4,"grad_v");
  pgVar5 = test_case::ggml_new_tensor_1d(&this->super_test_case,ctx,GGML_TYPE_F32,7);
  ggml_set_name(pgVar5,"adamw_params");
  pgVar1 = (ggml_tensor *)ggml_opt_step_adamw(ctx,pgVar1,pgVar2,pgVar3,pgVar4,pgVar5);
  ggml_set_name(pgVar1,"out");
  return pgVar1;
}

Assistant:

ggml_tensor * build_graph(ggml_context * ctx) override {
        ggml_tensor * a = ggml_new_tensor_4d(ctx, type, ne[0], ne[1], ne[2], ne[3]);
        ggml_set_param(ctx, a); // Despite tensor a having gradients the output tensor will not.
        ggml_set_name(a, "a");

        ggml_tensor * grad = ggml_new_tensor_4d(ctx, type, ne[0], ne[1], ne[2], ne[3]);
        ggml_set_name(grad, "grad");

        ggml_tensor * grad_m = ggml_new_tensor_4d(ctx, type, ne[0], ne[1], ne[2], ne[3]);
        ggml_set_name(grad_m, "grad_m");

        ggml_tensor * grad_v = ggml_new_tensor_4d(ctx, type, ne[0], ne[1], ne[2], ne[3]);
        ggml_set_name(grad_v, "grad_v");

        ggml_tensor * adamw_params = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, 7);
        ggml_set_name(adamw_params, "adamw_params");

        ggml_tensor * out = ggml_opt_step_adamw(ctx, a, grad, grad_m, grad_v, adamw_params);
        ggml_set_name(out, "out");

        return out;
    }